

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTPNArglist * __thiscall CTcPrsOpBinGroupCompare::parse_inlist(CTcPrsOpBinGroupCompare *this)

{
  undefined1 *puVar1;
  CTPNArg *pCVar2;
  int iVar3;
  tc_toktyp_t tVar4;
  CTcPrsNode *pCVar5;
  CTPNArg *pCVar6;
  ulong uVar7;
  CTPNArglist *pCVar8;
  CTPNArg *pCVar9;
  int iVar10;
  CTPNArg *pCVar11;
  
  tVar4 = CTcTokenizer::next(G_tok);
  if (tVar4 == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
  }
  else {
    CTcTokenizer::log_error_curtok(G_tok,0x2ba3);
  }
  if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
    pCVar9 = (CTPNArg *)0x0;
    iVar10 = 0;
  }
  else {
    pCVar9 = (CTPNArg *)0x0;
    pCVar11 = (CTPNArg *)0x0;
    iVar3 = 1;
    do {
      iVar10 = iVar3;
      pCVar5 = CTcPrsOpAsi::parse(&S_op_asi);
      if (pCVar5 == (CTcPrsNode *)0x0) {
        return (CTPNArglist *)0x0;
      }
      pCVar6 = (CTPNArg *)CTcPrsMem::alloc(G_prsmem,0x48);
      (pCVar6->super_CTPNArgBase).arg_expr_ = pCVar5;
      (pCVar6->super_CTPNArgBase).next_arg_ = (CTPNArg *)0x0;
      puVar1 = &(pCVar6->super_CTPNArgBase).field_0x40;
      *puVar1 = *puVar1 & 0xfe;
      (pCVar6->super_CTPNArgBase).name_.typ_ = TOKT_INVALID;
      (pCVar6->super_CTPNArgBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR_gen_code_0035b078;
      pCVar2 = pCVar6;
      if (pCVar11 != (CTPNArg *)0x0) {
        (pCVar11->super_CTPNArgBase).next_arg_ = pCVar6;
        pCVar2 = pCVar9;
      }
      pCVar9 = pCVar2;
      uVar7 = (ulong)(G_tok->curtok_).typ_;
      if (uVar7 < 0x2b) {
        if (uVar7 != 0x15) {
          if ((0x40001830000U >> (uVar7 & 0x3f) & 1) != 0) {
            CTcTokenizer::log_error_curtok(G_tok,0x2ba5);
            goto LAB_0022b798;
          }
          if (uVar7 != 0x14) goto LAB_0022b75f;
          break;
        }
        CTcTokenizer::next(G_tok);
        tVar4 = (G_tok->curtok_).typ_;
      }
      else {
LAB_0022b75f:
        CTcTokenizer::log_error_curtok(G_tok,0x2ba4);
        tVar4 = (G_tok->curtok_).typ_;
        if (tVar4 == TOKT_EOF) goto LAB_0022b798;
      }
      pCVar11 = pCVar6;
      iVar3 = iVar10 + 1;
    } while (tVar4 != TOKT_RPAR);
  }
  CTcTokenizer::next(G_tok);
LAB_0022b798:
  pCVar8 = (CTPNArglist *)CTcPrsMem::alloc(G_prsmem,0x18);
  (pCVar8->super_CTPNArglistBase).argc_ = iVar10;
  (pCVar8->super_CTPNArglistBase).list_ = pCVar9;
  (pCVar8->super_CTPNArglistBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR_gen_code_00354918;
  return pCVar8;
}

Assistant:

CTPNArglist *CTcPrsOpBinGroupCompare::parse_inlist() const
{
    int argc;
    CTPNArg *arg_head;
    CTPNArg *arg_tail;

    /* skip the second keyword token, and check for an open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip the paren */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, and keep going on the assumption that it was
         *   merely omitted and the rest of the list is well-formed 
         */
        G_tok->log_error_curtok(TCERR_IN_REQ_LPAR);
    }

    /* keep going until we find the close paren */
    for (argc = 0, arg_head = arg_tail = 0 ;; )
    {
        CTcPrsNode *expr;
        CTPNArg *arg_cur;

        /* if this is the close paren, we're done */
        if (G_tok->cur() == TOKT_RPAR)
            break;

        /* parse this expression */
        expr = S_op_asi.parse();
        if (expr == 0)
            return 0;

        /* count the argument */
        ++argc;

        /* create a new argument node */
        arg_cur = new CTPNArg(expr);

        /* 
         *   link the new node at the end of our list (this preserves the
         *   order of the original list) 
         */
        if (arg_tail != 0)
            arg_tail->set_next_arg(arg_cur);
        else
            arg_head = arg_cur;
        arg_tail = arg_cur;

        /* we need to be looking at a comma or right paren */
        if (G_tok->cur() == TOKT_RPAR)
        {
            /* that's the end of the list */
            break;
        }
        else if (G_tok->cur() == TOKT_COMMA)
        {
            /* skip the comma and parse the next argument */
            G_tok->next();
        }
        else
        {
            /* 
             *   If we're at the end of the file, there's no point
             *   proceding, so return failure.  If we've reached something
             *   that looks like a statement separator (semicolon, curly
             *   brace), also return failure, since the problem is clearly
             *   a missing right paren.  Otherwise, assume that a comma
             *   was missing and continue as though we have another
             *   argument.  
             */
            switch(G_tok->cur())
            {
            default:
                /* log an error */
                G_tok->log_error_curtok(TCERR_EXPECTED_IN_COMMA);

                /* 
                 *   if we're at the end of file, return what we have so
                 *   far; otherwise continue, assuming that they merely
                 *   left out a comma between two argument expressions 
                 */
                if (G_tok->cur() == TOKT_EOF)
                    return new CTPNArglist(argc, arg_head);
                break;

            case TOKT_SEM:
            case TOKT_LBRACE:
            case TOKT_RBRACE:
            case TOKT_DSTR_MID:
            case TOKT_DSTR_END:
                /* 
                 *   we're apparently at the end of the statement; flag
                 *   the error as a missing right paren, and return what
                 *   we have so far 
                 */
                G_tok->log_error_curtok(TCERR_EXPECTED_IN_RPAR);
                return new CTPNArglist(argc, arg_head);
            }
        }
    }

    /* skip the closing paren */
    G_tok->next();

    /* create and return the argument list descriptor */
    return new CTPNArglist(argc, arg_head);
}